

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O0

QuadRule * lf::quad::make_TriaQR_P6O4(void)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  QuadRule *in_RDI;
  Matrix<double,__1,_1,_0,__1,_1> local_e0;
  Matrix<double,__1,__1,_0,__1,__1> local_d0;
  RefEl local_b1;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  int local_44;
  undefined1 local_40 [8];
  VectorXd weights;
  undefined1 local_28 [8];
  MatrixXd points;
  
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 2;
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 6;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_28,
             (int *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),
             (int *)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  local_44 = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,&local_44);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0);
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0);
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,1);
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,1);
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,2);
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,2);
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,3);
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,3);
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,4);
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,4);
  *pSVar1 = 0.6666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,5);
  *pSVar1 = 0.6666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,5);
  *pSVar1 = 0.16666666666666666;
  local_80 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_78,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,&local_80);
  local_88 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_78,&local_88);
  local_90 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_90);
  local_98 = 9.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_98);
  local_a0 = 9.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_a0);
  local_a8 = 9.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_78);
  local_b0 = 60.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,&local_b0);
  local_b1 = lf::base::RefEl::kTria();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_d0,(Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_e0,(Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  QuadRule::QuadRule(in_RDI,local_b1,&local_d0,&local_e0,3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return in_RDI;
}

Assistant:

QuadRule make_TriaQR_P6O4() {
  Eigen::MatrixXd points(2, 6);
  Eigen::VectorXd weights(6);

  points(0, 0) = 0.5;
  points(1, 0) = 0.0;
  points(0, 1) = 0.5;
  points(1, 1) = 0.5;
  points(0, 2) = 0.0;
  points(1, 2) = 0.5;
  points(0, 3) = 1.0 / 6.0;
  points(1, 3) = 1.0 / 6.0;
  points(0, 4) = 1.0 / 6.0;
  points(1, 4) = 2.0 / 3.0;
  points(0, 5) = 2.0 / 3.0;
  points(1, 5) = 1.0 / 6.0;

  weights << 1.0, 1.0, 1.0, 9.0, 9.0, 9.0;
  weights /= 60.0;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights),
                  3);
}